

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O1

int __thiscall CVmConsole::open_command_log(CVmConsole *this,char *fname,int event_script)

{
  long lVar1;
  void *pvVar2;
  int iVar3;
  CVmNetFile *nf;
  long *in_FS_OFFSET;
  err_frame_t err_cur__;
  uint local_108 [2];
  long local_100;
  void *local_f8;
  __jmp_buf_tag local_f0;
  undefined4 extraout_var;
  
  G_err_frame::__tls_init();
  local_100 = *in_FS_OFFSET;
  G_err_frame::__tls_init();
  *in_FS_OFFSET = (long)local_108;
  local_108[0] = _setjmp(&local_f0);
  if (local_108[0] == 0) {
    iVar3 = CVmNetFile::open(fname,0,0xe,5,"text/plain");
    nf = (CVmNetFile *)CONCAT44(extraout_var,iVar3);
  }
  else {
    nf = (CVmNetFile *)0x0;
  }
  lVar1 = local_100;
  if (local_108[0] == 1) {
    local_108[0] = 2;
    nf = (CVmNetFile *)0x0;
  }
  G_err_frame::__tls_init();
  *in_FS_OFFSET = lVar1;
  if ((local_108[0] & 0x4001) != 0) {
    G_err_frame::__tls_init();
    if ((*(byte *)*in_FS_OFFSET & 2) != 0) {
      G_err_frame::__tls_init();
      free(*(void **)(*in_FS_OFFSET + 0x10));
    }
    pvVar2 = local_f8;
    G_err_frame::__tls_init();
    *(void **)(*in_FS_OFFSET + 0x10) = pvVar2;
    err_rethrow();
  }
  if ((local_108[0] & 2) != 0) {
    free(local_f8);
  }
  iVar3 = open_command_log(this,nf,event_script);
  return iVar3;
}

Assistant:

int CVmConsole::open_command_log(VMG_ const char *fname, int event_script)
{
    CVmNetFile *nf = 0;
    err_try
    {
        /* create the network file descriptor */
        nf = CVmNetFile::open(vmg_ fname, 0, NETF_NEW, OSFTCMD, "text/plain");
    }